

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O1

ps_latlink_t *
ps_lattice_bestpath(ps_lattice_t *dag,ngram_model_t *lmset,float32 lwf,float32 ascale)

{
  uint uVar1;
  logmath_t *lmath;
  ps_lattice_t *ppVar2;
  ps_lattice_t *ppVar3;
  int iVar4;
  int32 iVar5;
  int iVar6;
  ps_latlink_t *ppVar7;
  ps_latlink_s *ppVar8;
  ps_latnode_t *ppVar9;
  latlink_list_t *plVar10;
  ps_latlink_t *ppVar11;
  uint uVar12;
  char *pcVar13;
  bool bVar14;
  bool bVar15;
  int32 w3_wid;
  int32 local_6c;
  ngram_model_t *local_68;
  ps_search_t *local_60;
  int32 n_used;
  float32 local_54;
  float32 local_50;
  uint local_4c;
  uint local_48;
  int32 local_44;
  logmath_t *local_40;
  ps_lattice_t *local_38;
  
  lmath = dag->lmath;
  local_60 = dag->search;
  local_68 = lmset;
  local_54 = lwf;
  local_50 = ascale;
  for (ppVar9 = dag->nodes; ppVar9 != (ps_latnode_t *)0x0; ppVar9 = ppVar9->next) {
    for (plVar10 = ppVar9->exits; plVar10 != (latlink_list_t *)0x0; plVar10 = plVar10->next) {
      plVar10->link->path_scr = -0x80000000;
      iVar4 = logmath_get_zero(lmath);
      plVar10->link->alpha = iVar4;
    }
  }
  plVar10 = dag->start->exits;
  local_40 = lmath;
  if (plVar10 != (latlink_list_t *)0x0) {
    do {
      iVar4 = dict_filler_word(local_60->dict,plVar10->link->to->basewid);
      if (iVar4 == 0) {
        bVar14 = false;
      }
      else {
        bVar14 = plVar10->link->to != dag->end;
      }
      ppVar7 = plVar10->link;
      ppVar7->path_scr = ppVar7->ascr;
      if ((local_68 != (ngram_model_t *)0x0) && (!bVar14)) {
        iVar5 = ngram_bg_score(local_68,ppVar7->to->basewid,local_60->start_wid,&n_used);
        plVar10->link->path_scr =
             (int)((float)(iVar5 >> 10) * (float)local_54 + (float)plVar10->link->path_scr);
      }
      ppVar7 = plVar10->link;
      ppVar7->best_prev = (ps_latlink_s *)0x0;
      ppVar7->alpha = 0;
      plVar10 = plVar10->next;
    } while (plVar10 != (latlink_list_s *)0x0);
  }
  ppVar7 = ps_lattice_traverse_edges(dag,(ps_latnode_t *)0x0,(ps_latnode_t *)0x0);
  ppVar3 = dag;
  ppVar2 = local_38;
  while (local_38 = ppVar3, ppVar7 != (ps_latlink_t *)0x0) {
    w3_wid = ppVar7->from->basewid;
    local_6c = ppVar7->to->basewid;
    iVar4 = dict_filler_word(local_60->dict,w3_wid);
    if (iVar4 == 0) {
      uVar12 = 0;
    }
    else {
      uVar12 = (uint)(ppVar7->from != dag->start);
    }
    iVar4 = dict_filler_word(local_60->dict,local_6c);
    if (iVar4 == 0) {
      bVar14 = false;
    }
    else {
      bVar14 = ppVar7->to != dag->end;
    }
    local_44 = 0;
    ppVar8 = ppVar7;
    if ((short)uVar12 == 0) {
      uVar12 = 0;
    }
    else {
      do {
        ppVar11 = ppVar8->best_prev;
        if (ppVar11 == (ps_latlink_t *)0x0) goto LAB_00110356;
        w3_wid = ppVar11->from->basewid;
        iVar4 = dict_filler_word(local_60->dict,w3_wid);
        ppVar8 = ppVar11;
      } while ((iVar4 != 0) && (ppVar11->from != dag->start));
      uVar12 = 0;
    }
LAB_00110356:
    if (((short)uVar12 == 0 && local_68 != (ngram_model_t *)0x0) && !bVar14) {
      local_44 = ngram_ng_prob(local_68,local_6c,&w3_wid,1,&n_used);
    }
    ppVar7->alpha = (int)((float)(ppVar7->ascr << 10) * (float)local_50 + (float)ppVar7->alpha);
    if (bVar14) {
      ppVar9 = (ps_latnode_t *)(ulong)(uint)w3_wid;
      local_6c = w3_wid;
      do {
        ppVar8 = ppVar8->best_prev;
        if (ppVar8 == (ps_latlink_s *)0x0) {
          local_4c = (uint)CONCAT62((int6)((ulong)ppVar9 >> 0x10),1);
          local_48 = uVar12;
          goto LAB_00110412;
        }
        w3_wid = ppVar8->from->basewid;
        iVar4 = dict_filler_word(local_60->dict,w3_wid);
      } while ((iVar4 != 0) && (ppVar9 = ppVar8->from, ppVar9 != dag->start));
      local_4c = 0;
      local_48 = uVar12;
    }
    else {
      local_48 = 0;
      local_4c = uVar12;
    }
LAB_00110412:
    for (plVar10 = ppVar7->to->exits; plVar10 != (latlink_list_t *)0x0; plVar10 = plVar10->next) {
      iVar5 = plVar10->link->to->basewid;
      iVar4 = dict_filler_word(local_60->dict,iVar5);
      if (iVar4 == 0) {
        bVar14 = false;
      }
      else {
        bVar14 = plVar10->link->to != dag->end;
      }
      bVar15 = local_68 != (ngram_model_t *)0x0;
      iVar4 = logmath_add(local_40,plVar10->link->alpha,ppVar7->alpha + local_44);
      ppVar11 = plVar10->link;
      ppVar11->alpha = iVar4;
      iVar4 = ppVar11->ascr + ppVar7->path_scr;
      if ((!bVar14 && (local_48 & 1) == 0) && bVar15) {
        if ((short)local_4c == 0) {
          iVar6 = ngram_tg_score(local_68,iVar5,local_6c,w3_wid,&n_used);
        }
        else {
          iVar6 = ngram_bg_score(local_68,iVar5,local_6c,&n_used);
        }
        iVar4 = (int)((float)(iVar6 >> 10) * (float)local_54 + (float)iVar4);
      }
      ppVar11 = plVar10->link;
      if (ppVar11->path_scr < iVar4) {
        ppVar11->path_scr = iVar4;
        ppVar11->best_prev = ppVar7;
      }
      dag = local_38;
    }
    ppVar7 = ps_lattice_traverse_next(dag,(ps_latnode_t *)0x0);
    ppVar3 = local_38;
    ppVar2 = local_38;
  }
  local_38 = ppVar2;
  iVar4 = logmath_get_zero(local_40);
  dag->norm = iVar4;
  plVar10 = dag->end->entries;
  uVar12 = 0x80000000;
  ppVar7 = (ps_latlink_t *)0x0;
  do {
    if (plVar10 == (latlink_list_t *)0x0) {
      dag->norm = (int)((float)(dag->final_node_ascr << 10) * (float)local_50 + (float)dag->norm);
      pcVar13 = (char *)0x0;
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
              ,0x566,"Bestpath score: %d\n",(ulong)uVar12);
      ppVar9 = dag->end;
      if (-1 < (long)ppVar9->wid) {
        pcVar13 = dag->search->dict->word[ppVar9->wid].word;
      }
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
              ,0x56a,"Normalizer P(O) = alpha(%s:%d:%d) = %d\n",pcVar13,(ulong)(uint)ppVar9->sf,
              (ulong)(uint)ppVar9->lef,(ulong)(uint)dag->norm);
      return ppVar7;
    }
    w3_wid = plVar10->link->from->basewid;
    iVar4 = dict_filler_word(local_60->dict,w3_wid);
    if (iVar4 != 0) {
      ppVar11 = plVar10->link;
      do {
        if (ppVar11->from == dag->start) break;
        ppVar11 = ppVar11->best_prev;
        bVar14 = ppVar11 == (ps_latlink_s *)0x0;
        if (bVar14) goto LAB_001105a9;
        w3_wid = ppVar11->from->basewid;
        iVar4 = dict_filler_word(local_60->dict,w3_wid);
      } while (iVar4 != 0);
    }
    bVar14 = false;
LAB_001105a9:
    iVar4 = 0;
    if ((local_68 != (ngram_model_t *)0x0) && (iVar4 = 0, !bVar14)) {
      iVar4 = ngram_ng_prob(local_68,plVar10->link->to->basewid,&w3_wid,1,&n_used);
    }
    iVar4 = logmath_add(local_40,dag->norm,iVar4 + plVar10->link->alpha);
    dag->norm = iVar4;
    uVar1 = plVar10->link->path_scr;
    if ((int)uVar12 < (int)uVar1) {
      ppVar7 = plVar10->link;
      uVar12 = uVar1;
    }
    plVar10 = plVar10->next;
  } while( true );
}

Assistant:

ps_latlink_t *
ps_lattice_bestpath(ps_lattice_t *dag, ngram_model_t *lmset,
                    float32 lwf, float32 ascale)
{
    ps_search_t *search;
    ps_latnode_t *node;
    ps_latlink_t *link;
    ps_latlink_t *bestend;
    latlink_list_t *x;
    logmath_t *lmath;
    int32 bestescr;

    search = dag->search;
    lmath = dag->lmath;

    /* Initialize path scores for all links exiting dag->start, and
     * set all other scores to the minimum.  Also initialize alphas to
     * log-zero. */
    for (node = dag->nodes; node; node = node->next) {
        for (x = node->exits; x; x = x->next) {
            x->link->path_scr = MAX_NEG_INT32;
            x->link->alpha = logmath_get_zero(lmath);
        }
    }
    for (x = dag->start->exits; x; x = x->next) {
        int32 n_used;
        int16 to_is_fil;

        to_is_fil = dict_filler_word(ps_search_dict(search), x->link->to->basewid) && x->link->to != dag->end;

        /* Best path points to dag->start, obviously. */
        x->link->path_scr = x->link->ascr;
        if (lmset && !to_is_fil)
            x->link->path_scr += (ngram_bg_score(lmset, x->link->to->basewid,
                                ps_search_start_wid(search), &n_used) >> SENSCR_SHIFT) * lwf;
        x->link->best_prev = NULL;
        /* No predecessors for start links. */
        x->link->alpha = 0;
    }

    /* Traverse the edges in the graph, updating path scores. */
    for (link = ps_lattice_traverse_edges(dag, NULL, NULL);
         link; link = ps_lattice_traverse_next(dag, NULL)) {
        int32 bprob, n_used;
        int32 w3_wid, w2_wid;
        int16 w3_is_fil, w2_is_fil;
        ps_latlink_t *prev_link;

        /* Sanity check, we should not be traversing edges that
         * weren't previously updated, otherwise nasty overflows will result. */
        assert(link->path_scr != MAX_NEG_INT32);

        /* Find word predecessor if from-word is filler */
        w3_wid = link->from->basewid;
        w2_wid = link->to->basewid;
        w3_is_fil = dict_filler_word(ps_search_dict(search), link->from->basewid) && link->from != dag->start;
        w2_is_fil = dict_filler_word(ps_search_dict(search), w2_wid) && link->to != dag->end;
        prev_link = link;

        if (w3_is_fil) {
            while (prev_link->best_prev != NULL) {
                prev_link = prev_link->best_prev;
                w3_wid = prev_link->from->basewid;
                if (!dict_filler_word(ps_search_dict(search), w3_wid) || prev_link->from == dag->start) {
                    w3_is_fil = FALSE;
                    break;
                }
            }
        }

        /* Calculate common bigram probability for all alphas. */
        if (lmset && !w3_is_fil && !w2_is_fil)
            bprob = ngram_ng_prob(lmset, w2_wid, &w3_wid, 1, &n_used);
        else
            bprob = 0;
        /* Add in this link's acoustic score, which was a constant
           factor in previous computations (if any). */
        link->alpha += (link->ascr << SENSCR_SHIFT) * ascale;

        if (w2_is_fil) {
            w2_is_fil = w3_is_fil;
            w3_is_fil = TRUE;
            w2_wid = w3_wid;
            while (prev_link->best_prev != NULL) {
                prev_link = prev_link->best_prev;
                w3_wid = prev_link->from->basewid;
                if (!dict_filler_word(ps_search_dict(search), w3_wid) || prev_link->from == dag->start) {
                    w3_is_fil = FALSE;
                    break;
                }
            }
        }

        /* Update scores for all paths exiting link->to. */
        for (x = link->to->exits; x; x = x->next) {
            int32 score;
            int32 w1_wid;
            int16 w1_is_fil;

            w1_wid = x->link->to->basewid;
            w1_is_fil = dict_filler_word(ps_search_dict(search), w1_wid) && x->link->to != dag->end;

            /* Update alpha with sum of previous alphas. */
            x->link->alpha = logmath_add(lmath, x->link->alpha, link->alpha + bprob);

            /* Update link score with maximum link score. */
            score = link->path_scr + x->link->ascr;
            /* Calculate language score for bestpath if possible */
            if (lmset && !w1_is_fil && !w2_is_fil) {
                if (w3_is_fil)
                    /* partial context available */
                    score += (ngram_bg_score(lmset, w1_wid, w2_wid, &n_used) >> SENSCR_SHIFT) * lwf;
                else
                    /* full context available */
                    score += (ngram_tg_score(lmset, w1_wid, w2_wid, w3_wid, &n_used) >> SENSCR_SHIFT) * lwf;
            }

            if (score BETTER_THAN x->link->path_scr) {
                x->link->path_scr = score;
                x->link->best_prev = link;
            }
        }
    }

    /* Find best link entering final node, and calculate normalizer
     * for posterior probabilities. */
    bestend = NULL;
    bestescr = MAX_NEG_INT32;

    /* Normalizer is the alpha for the imaginary link exiting the
       final node. */
    dag->norm = logmath_get_zero(lmath);
    for (x = dag->end->entries; x; x = x->next) {
        int32 bprob, n_used;
        int32 from_wid;
        int16 from_is_fil;

        from_wid = x->link->from->basewid;
        from_is_fil = dict_filler_word(ps_search_dict(search), from_wid) && x->link->from != dag->start;
        if (from_is_fil) {
            ps_latlink_t *prev_link = x->link;
            while (prev_link->best_prev != NULL) {
                prev_link = prev_link->best_prev;
                from_wid = prev_link->from->basewid;
                if (!dict_filler_word(ps_search_dict(search), from_wid) || prev_link->from == dag->start) {
                    from_is_fil = FALSE;
                    break;
                }
            }
        }

        if (lmset && !from_is_fil)
            bprob = ngram_ng_prob(lmset,
                                  x->link->to->basewid,
                                  &from_wid, 1, &n_used);
        else
            bprob = 0;
        dag->norm = logmath_add(lmath, dag->norm, x->link->alpha + bprob);
        if (x->link->path_scr BETTER_THAN bestescr) {
            bestescr = x->link->path_scr;
            bestend = x->link;
        }
    }
    /* FIXME: floating point... */
    /* FIXME: possible under/overflow!!! */
    dag->norm += (int32)(dag->final_node_ascr << SENSCR_SHIFT) * ascale;

    E_INFO("Bestpath score: %d\n", bestescr);
    E_INFO("Normalizer P(O) = alpha(%s:%d:%d) = %d\n",
           dict_wordstr(dag->search->dict, dag->end->wid),
           dag->end->sf, dag->end->lef,
           dag->norm);
    return bestend;
}